

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void __thiscall logger::Channel::SetPrefix(Channel *this,string *prefix)

{
  string *in_RSI;
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> locker;
  mutex_type *in_stack_ffffffffffffffc8;
  
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffc8);
  std::__cxx11::string::operator=((string *)(in_RDI + 7),in_RSI);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x128535);
  return;
}

Assistant:

void Channel::SetPrefix(const std::string& prefix)
{
    std::lock_guard<std::mutex> locker(PrefixLock);
    Prefix = prefix;
}